

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_insert_node(lyxp_set *set,void *node,uint32_t pos,lyxp_node_type node_type,uint32_t idx)

{
  LY_ERR *pLVar1;
  lyxp_set_nodes *plVar2;
  uint32_t local_24;
  uint32_t idx_local;
  lyxp_node_type node_type_local;
  uint32_t pos_local;
  void *node_local;
  lyxp_set *set_local;
  
  if ((set == (lyxp_set *)0x0) ||
     ((set->type != LYXP_SET_NODE_SET && (set->type != LYXP_SET_EMPTY)))) {
    __assert_fail("set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x375,
                  "void set_insert_node(struct lyxp_set *, const void *, uint32_t, enum lyxp_node_type, uint32_t)"
                 );
  }
  local_24 = idx;
  if (set->type == LYXP_SET_EMPTY) {
    if (idx != 0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x37b);
      local_24 = 0;
    }
    plVar2 = (lyxp_set_nodes *)malloc(0x20);
    (set->val).nodes = plVar2;
    if ((set->val).nodes == (lyxp_set_nodes *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_insert_node");
      return;
    }
    set->type = LYXP_SET_NODE_SET;
    set->used = 0;
    set->size = 2;
    set->ctx_pos = 1;
    set->ctx_size = 1;
  }
  else {
    if (set->used == set->size) {
      plVar2 = (lyxp_set_nodes *)ly_realloc((set->val).nodes,(ulong)(set->size + 2) << 4);
      (set->val).nodes = plVar2;
      if ((set->val).nodes == (lyxp_set_nodes *)0x0) {
        pLVar1 = ly_errno_location();
        *pLVar1 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_insert_node");
        return;
      }
      set->size = set->size + 2;
    }
    if (set->used < idx) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x396);
      local_24 = set->used;
    }
    if (local_24 < set->used) {
      memmove((set->val).nodes + (local_24 + 1),(set->val).nodes + local_24,
              (ulong)(set->used - local_24) << 4);
    }
  }
  (set->val).nodes[local_24].node = (lyd_node *)node;
  (set->val).nodes[local_24].type = node_type;
  (set->val).nodes[local_24].pos = pos;
  set->used = set->used + 1;
  return;
}

Assistant:

static void
set_insert_node(struct lyxp_set *set, const void *node, uint32_t pos, enum lyxp_node_type node_type, uint32_t idx)
{
    assert(set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_EMPTY) {
        /* first item */
        if (idx) {
            /* no real harm done, but it is a bug */
            LOGINT;
            idx = 0;
        }
        set->val.nodes = malloc(LYXP_SET_SIZE_START * sizeof *set->val.nodes);
        if (!set->val.nodes) {
            LOGMEM;
            return;
        }
        set->type = LYXP_SET_NODE_SET;
        set->used = 0;
        set->size = LYXP_SET_SIZE_START;
        set->ctx_pos = 1;
        set->ctx_size = 1;
    } else {
        /* not an empty set */
        if (set->used == set->size) {

            /* set is full */
            set->val.nodes = ly_realloc(set->val.nodes, (set->size + LYXP_SET_SIZE_STEP) * sizeof *set->val.nodes);
            if (!set->val.nodes) {
                LOGMEM;
                return;
            }
            set->size += LYXP_SET_SIZE_STEP;
        }

        if (idx > set->used) {
            LOGINT;
            idx = set->used;
        }

        /* make space for the new node */
        if (idx < set->used) {
            memmove(&set->val.nodes[idx + 1], &set->val.nodes[idx], (set->used - idx) * sizeof *set->val.nodes);
        }
    }

    /* finally assign the value */
    set->val.nodes[idx].node = (struct lyd_node *)node;
    set->val.nodes[idx].type = node_type;
    set->val.nodes[idx].pos = pos;
    ++set->used;
}